

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentUtils.cpp
# Opt level: O0

DecPOMDPDiscreteInterface * ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(Arguments *args)

{
  ProblemAloha *this;
  long *plVar1;
  char *pcVar2;
  FactoredDecPOMDPDiscreteInterface *pFVar3;
  MultiAgentDecisionProcessDiscrete *pMVar4;
  ostream *poVar5;
  int *in_RDI;
  Arguments *in_stack_00000010;
  MADPParser parser_2;
  DecPOMDPDiscrete *decpomdp;
  MADPParser parser_1;
  POMDPDiscrete *pomdp;
  MADPParser parser;
  TOIFactoredRewardDecPOMDPDiscrete *toi;
  string dpomdpFile;
  ProblemAloha *p_3;
  ProblemFireFightingGraph *p_2;
  ProblemFireFightingFactored *p_1;
  ProblemDecTiger *p;
  DecPOMDPDiscreteInterface *dp;
  undefined1 in_stack_0000035f;
  double in_stack_00000360;
  size_t in_stack_00000368;
  size_t in_stack_00000370;
  size_t in_stack_00000378;
  ProblemFireFighting *in_stack_00000380;
  DecPOMDPDiscrete *in_stack_fffffffffffffd38;
  MADPParser *in_stack_fffffffffffffd40;
  string *in_stack_fffffffffffffd58;
  undefined1 uVar6;
  TransitionObservationIndependentMADPDiscrete *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd68;
  DecPOMDPDiscrete *in_stack_fffffffffffffd70;
  string *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  ProblemFireFightingGraph *in_stack_fffffffffffffd90;
  DecPOMDPDiscreteInterface *local_258;
  DecPOMDPDiscreteInterface *local_238;
  DecPOMDPDiscreteInterface *local_220;
  undefined8 in_stack_fffffffffffffdf0;
  Arguments *in_stack_fffffffffffffdf8;
  size_t in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  ProblemDecTiger *in_stack_fffffffffffffe10;
  DecPOMDPDiscreteInterface *local_1e0;
  undefined8 in_stack_fffffffffffffe28;
  undefined1 initialize;
  double in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  undefined1 forcePositionRepres;
  size_t in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  ProblemFireFightingFactored *in_stack_fffffffffffffe60;
  string local_188 [37];
  MADPParser local_163;
  undefined1 local_162;
  allocator<char> local_161;
  string local_160 [39];
  allocator<char> local_139;
  string local_138 [32];
  MultiAgentDecisionProcessDiscrete *local_118;
  MADPParser local_10b;
  undefined1 local_10a;
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [32];
  MultiAgentDecisionProcessDiscrete *local_c0;
  MADPParser local_b3;
  undefined1 local_b2;
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  long *local_68;
  string local_60 [32];
  ProblemAloha *local_40;
  long *local_38;
  long *local_30;
  long *local_18;
  DecPOMDPDiscreteInterface *local_10;
  int *local_8;
  
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffffdf0 >> 0x38);
  forcePositionRepres = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
  initialize = (undefined1)((ulong)in_stack_fffffffffffffe28 >> 0x38);
  local_10 = (DecPOMDPDiscreteInterface *)0x0;
  local_8 = in_RDI;
  switch(in_RDI[4]) {
  case 0:
  default:
    directories::MADPGetProblemFilename_abi_cxx11_(in_stack_fffffffffffffdf8);
    if (local_8[0x1b] == 0) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pcVar2 = strstr(pcVar2,".pgmx");
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        pcVar2 = strstr(pcVar2,".pomdp");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          pcVar2 = strstr(pcVar2,".POMDP");
          if (pcVar2 == (char *)0x0) {
            pMVar4 = (MultiAgentDecisionProcessDiscrete *)operator_new(0x230);
            local_162 = 1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                       (allocator<char> *)in_stack_fffffffffffffd70);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                       (allocator<char> *)in_stack_fffffffffffffd70);
            DecPOMDPDiscrete::DecPOMDPDiscrete
                      (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                       (string *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
            local_162 = 0;
            std::__cxx11::string::~string(local_160);
            std::allocator<char>::~allocator(&local_161);
            std::__cxx11::string::~string(local_138);
            std::allocator<char>::~allocator(&local_139);
            local_118 = pMVar4;
            if (local_8[0x1a] != 0) {
              MultiAgentDecisionProcessDiscrete::SetSparse(pMVar4,true);
            }
            MADPParser::MADPParser<DecPOMDPDiscrete>
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
            local_10 = (DecPOMDPDiscreteInterface *)0x0;
            if (local_118 != (MultiAgentDecisionProcessDiscrete *)0x0) {
              local_10 = (DecPOMDPDiscreteInterface *)
                         (&(local_118->super_MultiAgentDecisionProcess).field_0x0 +
                         *(long *)(*(long *)&local_118->super_MultiAgentDecisionProcess + -0x50));
            }
            MADPParser::~MADPParser(&local_163);
            goto LAB_008e25fb;
          }
        }
        pMVar4 = (MultiAgentDecisionProcessDiscrete *)operator_new(0x230);
        local_10a = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                   (allocator<char> *)in_stack_fffffffffffffd70);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                   (allocator<char> *)in_stack_fffffffffffffd70);
        POMDPDiscrete::POMDPDiscrete
                  ((POMDPDiscrete *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                   (string *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        local_10a = 0;
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator(&local_109);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator(&local_e1);
        local_c0 = pMVar4;
        if (local_8[0x1a] != 0) {
          MultiAgentDecisionProcessDiscrete::SetSparse(pMVar4,true);
        }
        MADPParser::MADPParser<POMDPDiscrete>
                  (in_stack_fffffffffffffd40,(POMDPDiscrete *)in_stack_fffffffffffffd38);
        local_258 = (DecPOMDPDiscreteInterface *)0x0;
        if (local_c0 != (MultiAgentDecisionProcessDiscrete *)0x0) {
          local_258 = (DecPOMDPDiscreteInterface *)
                      (&(local_c0->super_MultiAgentDecisionProcess).field_0x0 +
                      *(long *)(*(long *)&local_c0->super_MultiAgentDecisionProcess + -0x50));
        }
        local_10 = local_258;
        MADPParser::~MADPParser(&local_10b);
      }
      else {
        pFVar3 = GetFactoredDecPOMDPDiscreteInterfaceFromArgs(in_stack_00000010);
        local_238 = (DecPOMDPDiscreteInterface *)0x0;
        if (pFVar3 != (FactoredDecPOMDPDiscreteInterface *)0x0) {
          local_238 = (DecPOMDPDiscreteInterface *)
                      (&pFVar3->field_0x0 + *(long *)(*(long *)pFVar3 + -0xf0));
        }
        local_10 = local_238;
      }
    }
    else {
      plVar1 = (long *)operator_new(0x2e8);
      uVar6 = (undefined1)((ulong)in_stack_fffffffffffffd58 >> 0x38);
      local_b2 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                 (allocator<char> *)in_stack_fffffffffffffd70);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd80,(char *)in_stack_fffffffffffffd78,
                 (allocator<char> *)in_stack_fffffffffffffd70);
      TOIFactoredRewardDecPOMDPDiscrete::TOIFactoredRewardDecPOMDPDiscrete
                ((TOIFactoredRewardDecPOMDPDiscrete *)in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78,(string *)in_stack_fffffffffffffd70,
                 in_stack_fffffffffffffd68,SUB81((ulong)in_stack_fffffffffffffd60 >> 0x38,0));
      local_b2 = 0;
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator(&local_b1);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator(&local_89);
      local_68 = plVar1;
      if (local_8[0x1a] != 0) {
        TransitionObservationIndependentMADPDiscrete::SetSparse
                  (in_stack_fffffffffffffd60,(bool)uVar6);
      }
      MADPParser::MADPParser<TOIFactoredRewardDecPOMDPDiscrete>
                (in_stack_fffffffffffffd40,
                 (TOIFactoredRewardDecPOMDPDiscrete *)in_stack_fffffffffffffd38);
      local_220 = (DecPOMDPDiscreteInterface *)0x0;
      if (local_68 != (long *)0x0) {
        local_220 = (DecPOMDPDiscreteInterface *)((long)local_68 + *(long *)(*local_68 + -0x50));
      }
      local_10 = local_220;
      MADPParser::~MADPParser(&local_b3);
    }
LAB_008e25fb:
    if (0 < *local_8) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ArgumentUtils: Problem file ");
      poVar5 = std::operator<<(poVar5,local_60);
      poVar5 = std::operator<<(poVar5," parsed");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string(local_60);
    break;
  case 1:
    plVar1 = (long *)operator_new(0x250);
    ProblemDecTiger::ProblemDecTiger(in_stack_fffffffffffffe10);
    local_10 = (DecPOMDPDiscreteInterface *)0x0;
    local_18 = plVar1;
    if (plVar1 != (long *)0x0) {
      local_10 = (DecPOMDPDiscreteInterface *)((long)plVar1 + *(long *)(*plVar1 + -0x50));
    }
    break;
  case 2:
    plVar1 = (long *)operator_new(0x290);
    ProblemFireFighting::ProblemFireFighting
              (in_stack_00000380,in_stack_00000378,in_stack_00000370,in_stack_00000368,
               in_stack_00000360,(bool)in_stack_0000035f);
    local_10 = (DecPOMDPDiscreteInterface *)0x0;
    if (plVar1 != (long *)0x0) {
      local_10 = (DecPOMDPDiscreteInterface *)((long)plVar1 + *(long *)(*plVar1 + -0x50));
    }
    break;
  case 3:
    plVar1 = (long *)operator_new(0x790);
    ProblemFireFightingFactored::ProblemFireFightingFactored
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
               in_stack_fffffffffffffe48,(double)plVar1,(bool)forcePositionRepres,
               in_stack_fffffffffffffe30,(bool)initialize);
    local_30 = plVar1;
    if ((*(byte *)((long)local_8 + 0x65) & 1) != 0) {
      (**(code **)(*plVar1 + 0x300))(plVar1,local_8[0x1a] != 0);
    }
    local_10 = (DecPOMDPDiscreteInterface *)0x0;
    if (local_30 != (long *)0x0) {
      local_10 = (DecPOMDPDiscreteInterface *)((long)local_30 + *(long *)(*local_30 + -0x60));
    }
    break;
  case 4:
    plVar1 = (long *)operator_new(0x790);
    ProblemFireFightingGraph::ProblemFireFightingGraph
              (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80
               ,(double)in_stack_fffffffffffffd78,SUB81((ulong)in_stack_fffffffffffffd70 >> 0x38,0))
    ;
    local_38 = plVar1;
    if ((*(byte *)((long)local_8 + 0x65) & 1) != 0) {
      (**(code **)(*plVar1 + 0x300))(plVar1,local_8[0x1a] != 0);
    }
    local_1e0 = (DecPOMDPDiscreteInterface *)0x0;
    if (local_38 != (long *)0x0) {
      local_1e0 = (DecPOMDPDiscreteInterface *)((long)local_38 + *(long *)(*local_38 + -0x60));
    }
    local_10 = local_1e0;
    break;
  case 6:
    this = (ProblemAloha *)operator_new(0x748);
    ProblemAloha::ProblemAloha
              (this,(IslandConfiguration)((ulong)in_stack_fffffffffffffe08 >> 0x20),
               (AlohaVariation)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
               (size_t)in_stack_fffffffffffffdf8,(bool)uVar6);
    local_40 = this;
    if ((*(byte *)((long)local_8 + 0x65) & 1) != 0) {
      (**(code **)(*(long *)&(this->super_FactoredDecPOMDPDiscrete).
                             super_MultiAgentDecisionProcessDiscreteFactoredStates.
                             super_MultiAgentDecisionProcess + 0x300))(this,local_8[0x1a] != 0);
    }
    local_10 = (DecPOMDPDiscreteInterface *)0x0;
    if (local_40 != (ProblemAloha *)0x0) {
      local_10 = (DecPOMDPDiscreteInterface *)
                 (&(local_40->super_FactoredDecPOMDPDiscrete).
                   super_MultiAgentDecisionProcessDiscreteFactoredStates.
                   super_MultiAgentDecisionProcess.field_0x0 +
                 *(long *)(*(long *)&(local_40->super_FactoredDecPOMDPDiscrete).
                                     super_MultiAgentDecisionProcessDiscreteFactoredStates.
                                     super_MultiAgentDecisionProcess + -0x60));
    }
  }
  if (0.0 < *(double *)(local_8 + 0x1c)) {
    (**(code **)(*(long *)((long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0xb0)) + 0x68
                ))(*(undefined8 *)(local_8 + 0x1c),
                   (long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0xb0));
  }
  if (0 < *local_8) {
    poVar5 = std::operator<<((ostream *)&std::cout,"ArgumentUtils: Problem ");
    (**(code **)(*(long *)((long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0x40)) + 0x20
                ))(local_188,(long)&local_10->field_0x0 + *(long *)(*(long *)local_10 + -0x40));
    poVar5 = std::operator<<(poVar5,local_188);
    poVar5 = std::operator<<(poVar5," instantiated.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_188);
  }
  return local_10;
}

Assistant:

DecPOMDPDiscreteInterface* GetDecPOMDPDiscreteInterfaceFromArgs(const Arguments& args)
{
    DecPOMDPDiscreteInterface * dp = 0;
    switch(args.problem_type) 
    {

        case(ProblemType::DT):
        {
            ProblemDecTiger* p = new ProblemDecTiger();            
            dp = p;
            break;
        }
        case(ProblemType::FF):
        {
            dp = new ProblemFireFighting(args.nrAgents, args.nrHouses, 
                    args.nrFLs);
            break;
        }
        case(ProblemType::FFF):
        {
            ProblemFireFightingFactored* p = 
                new ProblemFireFightingFactored(args.nrAgents,
                                                args.nrHouses,
                                                args.nrFLs,
                                                0.0,
                                                false,
                                                args.extinguishProb);
            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }
        case(ProblemType::FFG):
        {
            ProblemFireFightingGraph* p = 
                new ProblemFireFightingGraph(args.nrAgents,
                                             args.nrFLs,
                                             args.extinguishProb);
            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }
        case(ProblemType::Aloha):
        {
            ProblemAloha* p =
                new ProblemAloha(   args.islandConf,
                                    args.alohaVariation,
                                    args.maxBacklog,
                                    args.nrAgents );

            if(args.cache_flat_models)
                p->CacheFlatModels(args.sparse);
            dp = p;
            break;
        }

        case(ProblemType::PARSE):
        default: //try to open the .dpomdp file and parse it
        {
            string dpomdpFile=directories::MADPGetProblemFilename(args);
            // load the DecPOMDP problem 
            if(args.isTOI)
            {
                TOIFactoredRewardDecPOMDPDiscrete *toi=
                    new TOIFactoredRewardDecPOMDPDiscrete("","",dpomdpFile,
                        args.cache_flat_models);
                if(args.sparse)
                    toi->SetSparse(true);
                MADPParser parser(toi);
#if 0 // this is done internally now
                if(args.cache_flat_models)
                {
                    if(args.sparse)
                        toi->CreateCentralizedSparseModels();
                    else
                        toi->CreateCentralizedFullModels();
                }                
#endif
                dp=toi;
            }
            else{
                if(strstr(dpomdpFile.c_str(),".pgmx"))
                    dp = GetFactoredDecPOMDPDiscreteInterfaceFromArgs(args);
                else if(
                        (strstr(dpomdpFile.c_str(),".pomdp"))
                    ||  (strstr(dpomdpFile.c_str(),".POMDP"))
                    )
                {
                    POMDPDiscrete* pomdp = 
                        new POMDPDiscrete("","",dpomdpFile);
                    if(args.sparse)
                        pomdp->SetSparse(true);
                    MADPParser parser(pomdp);
                    dp = pomdp;
                }
                else
                {
                    DecPOMDPDiscrete* decpomdp = 
                    new DecPOMDPDiscrete("","",dpomdpFile);
                    if(args.sparse)
                        decpomdp->SetSparse(true);
                    MADPParser parser(decpomdp);
                    dp = decpomdp;
                }
            }
            if(args.verbose > 0)
                cout << "ArgumentUtils: Problem file " << dpomdpFile << " parsed" << endl;
        }
    }
    if(args.discount > 0)
        dp->SetDiscount(args.discount);
            
    if(args.verbose > 0)
        cout << "ArgumentUtils: Problem " << dp->GetUnixName() 
             << " instantiated." << endl;

    return dp;
}